

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<xxx::v0::errc>::
Generators<Catch::Generators::GeneratorWrapper<xxx::v0::errc>>
          (Generators<xxx::v0::errc> *this,GeneratorWrapper<xxx::v0::errc> *moreGenerators)

{
  GeneratorWrapper<xxx::v0::errc> *moreGenerators_local;
  Generators<xxx::v0::errc> *this_local;
  
  IGenerator<xxx::v0::errc>::IGenerator(&this->super_IGenerator<xxx::v0::errc>);
  (this->super_IGenerator<xxx::v0::errc>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_00277cb0;
  std::
  vector<Catch::Generators::GeneratorWrapper<xxx::v0::errc>,_std::allocator<Catch::Generators::GeneratorWrapper<xxx::v0::errc>_>_>
  ::vector(&this->m_generators);
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<xxx::v0::errc>,_std::allocator<Catch::Generators::GeneratorWrapper<xxx::v0::errc>_>_>
  ::reserve(&this->m_generators,1);
  add_generators<Catch::Generators::GeneratorWrapper<xxx::v0::errc>>(this,moreGenerators);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }